

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigs.h
# Opt level: O0

int __thiscall
sigs::
BasicSignal<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::lock_guard<std::mutex>_>
::connect(BasicSignal<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::lock_guard<std::mutex>_>
          *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  undefined4 in_register_00000034;
  Entry *this_00;
  lock_guard<std::mutex> lock;
  Connection *conn;
  int iVar1;
  BasicSignal<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::lock_guard<std::mutex>_>
  *__args;
  BasicSignal<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::lock_guard<std::mutex>_>
  *in_stack_ffffffffffffff98;
  
  this_00 = (Entry *)CONCAT44(in_register_00000034,__fd);
  __args = this;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)this_00,(mutex_type *)this);
  makeConnection(in_stack_ffffffffffffff98);
  std::shared_ptr<sigs::ConnectionBase>::shared_ptr
            ((shared_ptr<sigs::ConnectionBase> *)this_00,(shared_ptr<sigs::ConnectionBase> *)this);
  iVar1 = (int)this;
  Entry::Entry((Entry *)__addr,(Slot *)__args,(Connection *)this_00);
  std::
  vector<sigs::BasicSignal<void(std::__cxx11::string),std::lock_guard<std::mutex>>::Entry,std::allocator<sigs::BasicSignal<void(std::__cxx11::string),std::lock_guard<std::mutex>>::Entry>>
  ::emplace_back<sigs::BasicSignal<void(std::__cxx11::string),std::lock_guard<std::mutex>>::Entry>
            ((vector<sigs::BasicSignal<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::lock_guard<std::mutex>_>::Entry>_>
              *)__addr,(Entry *)__args);
  Entry::~Entry(this_00);
  std::shared_ptr<sigs::ConnectionBase>::~shared_ptr((shared_ptr<sigs::ConnectionBase> *)0x1387eb);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x13880b);
  return iVar1;
}

Assistant:

Connection connect(Slot &&slot) noexcept
  {
    Lock lock(entriesMutex);
    auto conn = makeConnection();
    entries.emplace_back(Entry(std::move(slot), conn));
    return conn;
  }